

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni_cs.cpp
# Opt level: O0

wchar_t * t3_to_upper(wchar_t ch)

{
  uint uVar1;
  wchar_t *local_28;
  int ofs;
  case_table *e;
  wchar_t ch_local;
  wchar_t *local_8;
  
  if (case_tab[ch >> 7] == (case_table *)0x0) {
    local_8 = (wchar_t *)0x0;
  }
  else {
    uVar1 = (uint)case_tab[ch >> 7][ch & 0x7f].upper;
    if (uVar1 == 0) {
      local_28 = (wchar_t *)0x0;
    }
    else {
      local_28 = case_expansion + (int)uVar1;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

const wchar_t *t3_to_upper(wchar_t ch)
{
    case_table *e = case_tab[ch >> 7];
    if (e == 0)
        return 0;
    int ofs = e[ch & 127].upper;
    return ofs == 0 ? 0 : &case_expansion[ofs];
}